

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O2

int xmlNanoFTPQuit(void *ctx)

{
  int __fd;
  size_t sVar1;
  ssize_t sVar2;
  int iVar3;
  char buf [200];
  
  iVar3 = -1;
  if ((ctx != (void *)0x0) && (__fd = *(int *)((long)ctx + 0x44), __fd != -1)) {
    builtin_strncpy(buf,"QUIT\r\n",7);
    sVar1 = strlen(buf);
    sVar2 = send(__fd,buf,(long)(int)sVar1,0);
    iVar3 = 0;
    if ((int)sVar2 < 0) {
      __xmlIOErr(9,0,"send failed");
      iVar3 = (int)sVar2;
    }
  }
  return iVar3;
}

Assistant:

int
xmlNanoFTPQuit(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[200];
    int len, res;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);

    snprintf(buf, sizeof(buf), "QUIT\r\n");
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf); /* Just to be consistent, even though we know it can't have a % in it */
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    return(0);
}